

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

upb_Array * upb_Array_New(upb_Arena *a,upb_CType type)

{
  byte bVar1;
  upb_Array *array;
  
  bVar1 = _upb_CType_SizeLg2_dont_copy_me__upb_internal_use_only_size[type - kUpb_CType_Bool];
  array = (upb_Array *)upb_Arena_Malloc(a,(4L << (bVar1 & 0x3f)) + 0x18);
  if (array != (upb_Array *)0x0) {
    _upb_Array_SetTaggedPtr_dont_copy_me__upb_internal_use_only(array,array + 1,(long)(char)bVar1);
    array->size_dont_copy_me__upb_internal_use_only = 0;
    array->capacity_dont_copy_me__upb_internal_use_only = 4;
  }
  return array;
}

Assistant:

upb_Array* upb_Array_New(upb_Arena* a, upb_CType type) {
  const int lg2 = UPB_PRIVATE(_upb_CType_SizeLg2)(type);
  return UPB_PRIVATE(_upb_Array_New)(a, 4, lg2);
}